

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O0

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::WriteTypedArray<int,false,true>
          (SerializationCloner<Js::StreamWriter> *this,Src src)

{
  SCATypeId typeId;
  uint32 uVar1;
  TypedArrayBase *this_00;
  Engine *this_01;
  ArrayBufferBase *src_00;
  array_type *arr;
  Src src_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  typeId = TypedArrayTrace<int,_false,_true>::GetSCATypeId();
  WriteTypeId(this,typeId);
  this_00 = &VarTo<Js::TypedArray<int,false,true>>(src)->super_TypedArrayBase;
  this_01 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
            ::GetEngine(&this->
                         super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                       );
  src_00 = ArrayBufferParent::GetArrayBuffer(&this_00->super_ArrayBufferParent);
  SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone(this_01,src_00)
  ;
  uVar1 = Js::TypedArrayBase::GetByteOffset(this_00);
  Write(this,uVar1);
  uVar1 = ArrayObject::GetLength((ArrayObject *)this_00);
  Write(this,uVar1);
  return;
}

Assistant:

void WriteTypedArray(Src src) const
        {
            typedef TypedArrayTrace<T, clamped, isVirtual> trace_type;
            typedef typename trace_type::TypedArrayType array_type;

            WriteTypeId(trace_type::GetSCATypeId());
            array_type* arr = VarTo<array_type>(src);

            this->GetEngine()->Clone(arr->GetArrayBuffer());

            Write(arr->GetByteOffset());
            Write(arr->GetLength());
        }